

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O2

MessageLite * __thiscall
google::protobuf::internal::ExtensionSet::GetMessage
          (ExtensionSet *this,int number,MessageLite *default_value)

{
  CppType CVar1;
  const_iterator cVar2;
  LogMessage *pLVar3;
  _Base_ptr p_Var4;
  LogFinisher local_55;
  int number_local;
  LogMessage local_50;
  
  number_local = number;
  cVar2 = std::
          _Rb_tree<int,_std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>,_std::_Select1st<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>_>
          ::find((_Rb_tree<int,_std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>,_std::_Select1st<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>_>
                  *)this,&number_local);
  p_Var4 = (_Base_ptr)default_value;
  if ((_Rb_tree_header *)cVar2._M_node != &(this->extensions_)._M_t._M_impl.super__Rb_tree_header) {
    if (*(char *)((long)&cVar2._M_node[1]._M_left + 1) != '\0') {
      LogMessage::LogMessage
                (&local_50,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/extension_set.cc"
                 ,0x1bb);
      pLVar3 = LogMessage::operator<<
                         (&local_50,
                          "CHECK failed: ((iter->second).is_repeated ? REPEATED : OPTIONAL) == (OPTIONAL): "
                         );
      LogFinisher::operator=(&local_55,pLVar3);
      LogMessage::~LogMessage(&local_50);
    }
    CVar1 = anon_unknown_0::cpp_type(*(FieldType *)&cVar2._M_node[1]._M_left);
    if (CVar1 != CPPTYPE_MESSAGE) {
      LogMessage::LogMessage
                (&local_50,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/extension_set.cc"
                 ,0x1bb);
      pLVar3 = LogMessage::operator<<
                         (&local_50,
                          "CHECK failed: (cpp_type((iter->second).type)) == (WireFormatLite::CPPTYPE_MESSAGE): "
                         );
      LogFinisher::operator=(&local_55,pLVar3);
      LogMessage::~LogMessage(&local_50);
    }
    p_Var4 = cVar2._M_node[1]._M_parent;
    if (((ulong)cVar2._M_node[1]._M_left & 0x100000) != 0) {
      p_Var4 = (_Base_ptr)(**(code **)(*(long *)p_Var4 + 0x18))(p_Var4,default_value);
    }
  }
  return (MessageLite *)p_Var4;
}

Assistant:

const MessageLite& ExtensionSet::GetMessage(
    int number, const MessageLite& default_value) const {
  map<int, Extension>::const_iterator iter = extensions_.find(number);
  if (iter == extensions_.end()) {
    // Not present.  Return the default value.
    return default_value;
  } else {
    GOOGLE_DCHECK_TYPE(iter->second, OPTIONAL, MESSAGE);
    if (iter->second.is_lazy) {
      return iter->second.lazymessage_value->GetMessage(default_value);
    } else {
      return *iter->second.message_value;
    }
  }
}